

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtConvexTriangleCallback::processTriangle
          (cbtConvexTriangleCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  float fVar2;
  cbtDispatcher *pcVar3;
  cbtManifoldResult *pcVar4;
  _func_int **pp_Var5;
  undefined1 auVar6 [16];
  cbtScalar *pcVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar10;
  cbtPersistentManifold *pcVar11;
  cbtVector3 *p1;
  cbtCollisionObjectWrapper *pcVar12;
  CProfileSample __profile;
  cbtTriangleShape tm;
  CProfileSample local_e1;
  cbtDispatcher *local_e0;
  cbtCollisionObjectWrapper local_d8;
  cbtPolyhedralConvexShape local_b0;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long *plVar9;
  
  CProfileSample::CProfileSample(&local_e1,"cbtConvexTriangleCallback::processTriangle");
  fVar1 = triangle->m_floats[0];
  fVar2 = triangle[1].m_floats[0];
  auVar6 = vminss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
  auVar6 = vminss_avx(auVar6,ZEXT416((uint)triangle[2].m_floats[0]));
  if (auVar6._0_4_ <= (this->m_aabbMax).m_floats[0]) {
    auVar6 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
    lVar10 = 0x20;
    if (triangle[2].m_floats[0] < auVar6._0_4_) {
      lVar10 = (ulong)(fVar1 <= fVar2) << 4;
    }
    if ((this->m_aabbMin).m_floats[0] <= *(float *)((long)triangle->m_floats + lVar10)) {
      fVar1 = triangle->m_floats[2];
      fVar2 = triangle[1].m_floats[2];
      auVar6 = vminss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
      auVar6 = vminss_avx(auVar6,ZEXT416((uint)triangle[2].m_floats[2]));
      if (auVar6._0_4_ <= (this->m_aabbMax).m_floats[2]) {
        auVar6 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
        pcVar7 = triangle[1].m_floats;
        if (fVar2 < fVar1) {
          pcVar7 = triangle->m_floats;
        }
        if (auVar6._0_4_ <= triangle[2].m_floats[2]) {
          pcVar7 = triangle[2].m_floats;
        }
        if ((this->m_aabbMin).m_floats[2] <= pcVar7[2]) {
          fVar1 = triangle->m_floats[1];
          fVar2 = triangle[1].m_floats[1];
          auVar6 = vminss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
          auVar6 = vminss_avx(auVar6,ZEXT416((uint)triangle[2].m_floats[1]));
          if (auVar6._0_4_ <= (this->m_aabbMax).m_floats[1]) {
            auVar6 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2));
            pcVar7 = triangle[1].m_floats;
            if (fVar2 < fVar1) {
              pcVar7 = triangle->m_floats;
            }
            if (auVar6._0_4_ <= triangle[2].m_floats[1]) {
              pcVar7 = triangle[2].m_floats;
            }
            if (((this->m_aabbMin).m_floats[1] <= pcVar7[1]) &&
               (this->m_convexBodyWrap->m_shape->m_shapeType < 0x18)) {
              pcVar3 = this->m_dispatcher;
              cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&local_b0);
              local_b0.super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtPolyhedralConvexShape_00b48678;
              local_b0.super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
              m_shapeType = 1;
              local_60 = *(undefined8 *)triangle->m_floats;
              uStack_58 = *(undefined8 *)(triangle->m_floats + 2);
              local_50 = *(undefined8 *)triangle[1].m_floats;
              uStack_48 = *(undefined8 *)(triangle[1].m_floats + 2);
              local_40 = *(undefined8 *)triangle[2].m_floats;
              uStack_38 = *(undefined8 *)(triangle[2].m_floats + 2);
              local_b0.super_cbtConvexInternalShape.m_collisionMargin =
                   this->m_collisionMarginTriangle;
              local_d8.m_parent = this->m_triBodyWrap;
              local_d8.m_collisionObject = (local_d8.m_parent)->m_collisionObject;
              local_d8.m_worldTransform = (local_d8.m_parent)->m_worldTransform;
              fVar1 = this->m_resultOut->m_closestPointDistanceThreshold;
              if (0.0 < fVar1) {
                pcVar11 = (cbtPersistentManifold *)0x0;
              }
              else {
                pcVar11 = this->m_manifoldPtr;
              }
              local_e0 = pcVar3;
              local_d8.m_shape = (cbtCollisionShape *)&local_b0;
              local_d8.m_partId = partId;
              local_d8.m_index = triangleIndex;
              iVar8 = (*pcVar3->_vptr_cbtDispatcher[2])
                                (pcVar3,this->m_convexBodyWrap,&local_d8,pcVar11,
                                 (ulong)((0.0 < fVar1) + 1));
              plVar9 = (long *)CONCAT44(extraout_var,iVar8);
              pcVar4 = this->m_resultOut;
              pcVar12 = pcVar4->m_body0Wrap;
              if (pcVar12->m_collisionObject == this->m_triBodyWrap->m_collisionObject) {
                pcVar4->m_body0Wrap = &local_d8;
                (*(pcVar4->super_Result)._vptr_Result[2])
                          (pcVar4,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
              }
              else {
                pp_Var5 = (pcVar4->super_Result)._vptr_Result;
                pcVar12 = pcVar4->m_body1Wrap;
                pcVar4->m_body1Wrap = &local_d8;
                (*pp_Var5[3])(pcVar4,(ulong)(uint)partId,(ulong)(uint)triangleIndex);
              }
              (**(code **)(*plVar9 + 0x10))
                        (plVar9,this->m_convexBodyWrap,&local_d8,this->m_dispatchInfoPtr,
                         this->m_resultOut);
              (&this->m_resultOut->m_body0Wrap)
              [this->m_resultOut->m_body0Wrap->m_collisionObject !=
               this->m_triBodyWrap->m_collisionObject] = pcVar12;
              (**(code **)*plVar9)(plVar9);
              (*local_e0->_vptr_cbtDispatcher[0xf])(local_e0,plVar9);
              cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape(&local_b0);
            }
          }
        }
      }
    }
  }
  CProfileSample::~CProfileSample(&local_e1);
  return;
}

Assistant:

void cbtConvexTriangleCallback::processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
{
	BT_PROFILE("cbtConvexTriangleCallback::processTriangle");

	if (!TestTriangleAgainstAabb2(triangle, m_aabbMin, m_aabbMax))
	{
		return;
	}

	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);

	cbtCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

#if 0	
	
	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &cbtIDebugDraw::DBG_DrawWireframe ))
	{
		const cbtCollisionObject* ob = const_cast<cbtCollisionObject*>(m_triBodyWrap->getCollisionObject());
		cbtVector3 color(1,1,0);
		cbtTransform& tr = ob->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}
#endif

	if (m_convexBodyWrap->getCollisionShape()->isConvex())
	{
		cbtTriangleShape tm(triangle[0], triangle[1], triangle[2]);
		tm.setMargin(m_collisionMarginTriangle);

		cbtCollisionObjectWrapper triObWrap(m_triBodyWrap, &tm, m_triBodyWrap->getCollisionObject(), m_triBodyWrap->getWorldTransform(), partId, triangleIndex);  //correct transform?
		cbtCollisionAlgorithm* colAlgo = 0;

		if (m_resultOut->m_closestPointDistanceThreshold > 0)
		{
			colAlgo = ci.m_dispatcher1->findAlgorithm(m_convexBodyWrap, &triObWrap, 0, BT_CLOSEST_POINT_ALGORITHMS);
		}
		else
		{
			colAlgo = ci.m_dispatcher1->findAlgorithm(m_convexBodyWrap, &triObWrap, m_manifoldPtr, BT_CONTACT_POINT_ALGORITHMS);
		}
		const cbtCollisionObjectWrapper* tmpWrap = 0;

		if (m_resultOut->getBody0Internal() == m_triBodyWrap->getCollisionObject())
		{
			tmpWrap = m_resultOut->getBody0Wrap();
			m_resultOut->setBody0Wrap(&triObWrap);
			m_resultOut->setShapeIdentifiersA(partId, triangleIndex);
		}
		else
		{
			tmpWrap = m_resultOut->getBody1Wrap();
			m_resultOut->setBody1Wrap(&triObWrap);
			m_resultOut->setShapeIdentifiersB(partId, triangleIndex);
		}

		colAlgo->processCollision(m_convexBodyWrap, &triObWrap, *m_dispatchInfoPtr, m_resultOut);

		if (m_resultOut->getBody0Internal() == m_triBodyWrap->getCollisionObject())
		{
			m_resultOut->setBody0Wrap(tmpWrap);
		}
		else
		{
			m_resultOut->setBody1Wrap(tmpWrap);
		}

		colAlgo->~cbtCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
	}
}